

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateDefaultSubFramebufferBindCase::render
          (InvalidateDefaultSubFramebufferBindCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  void *pvVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  int iVar5;
  long lVar6;
  Context *pCVar7;
  int i_1;
  deUint32 tex;
  deUint32 fbo;
  deUint32 local_4d4;
  deUint32 local_4d0;
  deUint32 local_4cc;
  InvalidateDefaultSubFramebufferBindCase *local_4c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec4 local_4a8;
  Vec4 local_490;
  Surface *local_480;
  GradientShader gradShader;
  FlatColorShader flatShader;
  Texture2DShader texShader;
  
  fbo = 0;
  tex = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x28;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&gradShader,(iterator)0x0,
             (DataType *)&attachments);
  lVar6 = 0;
  do {
    *(undefined4 *)
     ((long)&attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar6 * 4) = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,(DataTypes *)&gradShader,TYPE_FLOAT_VEC4,(Vec4 *)&attachments,&local_4a8);
  if (gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments(&attachments,this->m_buffers);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4cc = (*pCVar7->_vptr_Context[0x75])(pCVar7,&flatShader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4d4 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&texShader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4d0 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&gradShader);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar5 = iVar2;
  }
  local_4c8 = this;
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  iVar2 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  local_480 = dst;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4a8.m_data[0] = 1.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,local_4cc,&local_4a8);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar7,local_4d4);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    local_490.m_data[lVar6] = 1.0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  FboTestUtil::GradientShader::setGradient(&gradShader,pCVar7,local_4d0,&local_4a8,&local_490);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  width = sglr::ContextWrapper::getWidth(this_00);
  height = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,0x8058,width,height,0,0x1908,0x1401,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,tex,0);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,0);
  FboTestCase::checkFramebufferStatus(&local_4c8->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4a8.m_data[0] = -1.0;
  local_4a8.m_data[1] = -1.0;
  local_4a8.m_data[2] = -1.0;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 1.0;
  sglr::drawQuad(pCVar7,local_4cc,(Vec3 *)&local_4a8,(Vec3 *)&local_490);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)CONCAT44(attachments.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         attachments.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 2),
             (deUint32 *)
             CONCAT44(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_),iVar5 >> 2,iVar2 >> 2,
             iVar3 / 2,iVar4 / 2);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4a8.m_data[0] = -1.0;
  local_4a8.m_data[1] = -1.0;
  local_4a8.m_data[2] = 0.0;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 0.0;
  sglr::drawQuad(pCVar7,local_4d0,(Vec3 *)&local_4a8,(Vec3 *)&local_490);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glClearColor(this_00,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glClearStencil(this_00,1);
  sglr::ContextWrapper::glScissor(this_00,iVar5 >> 2,iVar2 >> 2,iVar3 / 2,iVar4 / 2);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  sglr::ContextWrapper::glClear(this_00,local_4c8->m_buffers);
  sglr::ContextWrapper::glDisable(this_00,0xc11);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4a8.m_data[0] = -1.0;
  local_4a8.m_data[1] = -1.0;
  local_4a8.m_data._8_8_ = (ulong)(uint)local_4a8.m_data[3] << 0x20;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 0.0;
  sglr::drawQuad(pCVar7,local_4d4,(Vec3 *)&local_4a8,(Vec3 *)&local_490);
  iVar5 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&local_4c8->super_FboTestCase,local_480,0,0,iVar5,iVar2);
  pvVar1 = (void *)CONCAT44(attachments.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            attachments.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		deUint32			fbo				= 0;
		deUint32			tex				= 0;
		FlatColorShader		flatShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader		texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		GradientShader		gradShader		(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments		= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID	= getCurrentContext()->createProgram(&flatShader);
		deUint32			texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32			gradShaderID	= getCurrentContext()->createProgram(&gradShader);

		int				invalidateX		= getWidth()	/ 4;
		int				invalidateY		= getHeight()	/ 4;
		int				invalidateW		= getWidth()	/ 2;
		int				invalidateH		= getHeight()	/ 2;


		flatShader.setColor   (*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		texShader.setUniforms (*getCurrentContext(), texShaderID);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenFramebuffers		(1, &fbo);
		glGenTextures			(1, &tex);
		glBindTexture			(GL_TEXTURE_2D, tex);
		glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, getWidth(), getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		glTexParameteri			(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		glBindTexture			(GL_TEXTURE_2D, 0);
		checkFramebufferStatus	(GL_FRAMEBUFFER);

		glBindFramebuffer		(GL_FRAMEBUFFER, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Switch to fbo and render gradient into it.
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);
		glBindFramebuffer	(GL_FRAMEBUFFER, fbo);

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore default fbo.
		glBindFramebuffer	(GL_FRAMEBUFFER, 0);

		// Clear invalidated buffers.
		glClearColor	(0.0f, 1.0f, 0.0f, 1.0f);
		glClearStencil	(1);
		glScissor		(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable		(GL_SCISSOR_TEST);
		glClear			(m_buffers);
		glDisable		(GL_SCISSOR_TEST);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);
		glBindTexture	(GL_TEXTURE_2D, tex);

		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}